

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
               (tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *matcher_tuple,
               tuple<void_*,_unsigned_long> *value_tuple)

{
  MatcherInterface<void_*> *pMVar1;
  MatcherInterface<unsigned_long> *pMVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  
  pMVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>).
           super__Head_base<0UL,_testing::Matcher<void_*>,_false>._M_head_impl.
           super_MatcherBase<void_*>.impl_.value_;
  cVar3 = (**(code **)(*(long *)pMVar1 + 0x20))
                    (pMVar1,(value_tuple->super__Tuple_impl<0UL,_void_*,_unsigned_long>).
                            super__Head_base<0UL,_void_*,_false>._M_head_impl);
  if (cVar3 == '\0') {
    uVar4 = 0;
  }
  else {
    pMVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_>).
             super__Tuple_impl<1UL,_testing::Matcher<unsigned_long>_>.
             super__Head_base<1UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
             super_MatcherBase<unsigned_long>.impl_.value_;
    iVar5 = (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar2,(value_tuple->super__Tuple_impl<0UL,_void_*,_unsigned_long>).
                              super__Tuple_impl<1UL,_unsigned_long>.
                              super__Head_base<1UL,_unsigned_long,_false>._M_head_impl);
    uVar4 = (undefined1)iVar5;
  }
  return (bool)uVar4;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }